

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O1

void __thiscall
Assimp::SMDImporter::ParseVASection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte bVar1;
  pointer pFVar2;
  void *pvVar3;
  uint uVar4;
  byte *pbVar5;
  bool bVar6;
  int iVar7;
  byte *__s2;
  SMDImporter *this_00;
  long lVar8;
  int iTime;
  byte *apbStack_120 [2];
  ulong local_110;
  vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_> *local_108;
  char **local_100;
  Face local_f8;
  
  local_108 = &this->asTriangles;
  apbStack_120[1] = (byte *)szCurrent;
  local_110 = 0;
  local_100 = szCurrentOut;
LAB_00610aac:
  do {
    this->iLineNumber = this->iLineNumber + 1;
    __s2 = apbStack_120[1];
    while (((ulong)*__s2 < 0x21 && ((0x100002600U >> ((ulong)*__s2 & 0x3f) & 1) != 0))) {
      __s2 = __s2 + 1;
    }
    apbStack_120[1] = __s2;
    if (*__s2 == 0) goto LAB_00610c72;
    apbStack_120[0] = (byte *)0x610aec;
    iVar7 = strncmp("end",(char *)__s2,3);
    pbVar5 = apbStack_120[1];
    if (iVar7 == 0) {
      bVar1 = __s2[3];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        apbStack_120[1] = __s2 + (4 - (ulong)(bVar1 == 0));
LAB_00610c72:
        if (((int)local_110 != 2) &&
           (pFVar2 = (this->asTriangles).
                     super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
           (this->asTriangles).
           super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
           super__Vector_impl_data._M_start != pFVar2)) {
          (this->asTriangles).
          super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>._M_impl.
          super__Vector_impl_data._M_finish = pFVar2 + -1;
          lVar8 = -0x18;
          do {
            pvVar3 = *(void **)((long)pFVar2->avVertices + lVar8 + -8);
            if (pvVar3 != (void *)0x0) {
              apbStack_120[0] = (byte *)0x610cac;
              operator_delete(pvVar3);
            }
            lVar8 = lVar8 + -0x40;
          } while (lVar8 != -0xd8);
        }
        this->iLineNumber = this->iLineNumber + 1;
        while (((ulong)*apbStack_120[1] < 0x21 &&
               ((0x100002600U >> ((ulong)*apbStack_120[1] & 0x3f) & 1) != 0))) {
          apbStack_120[1] = apbStack_120[1] + 1;
        }
        *local_100 = (char *)apbStack_120[1];
        return;
      }
    }
    this_00 = (SMDImporter *)0x793225;
    apbStack_120[0] = (byte *)0x610b1c;
    iVar7 = strncmp("time",(char *)apbStack_120[1],4);
    if (iVar7 == 0) {
      bVar1 = pbVar5[4];
      if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        apbStack_120[1] = pbVar5 + 5;
        if (bVar1 == 0) {
          apbStack_120[1] = pbVar5 + 4;
        }
        local_f8.iTexture = 0;
        apbStack_120[0] = (byte *)0x610b5e;
        bVar6 = ParseSignedInt(this_00,(char *)apbStack_120[1],(char **)(apbStack_120 + 1),
                               (int *)&local_f8);
        if ((!bVar6) || (this->configFrameID != local_f8.iTexture)) goto LAB_00610c72;
        while ((0xd < *apbStack_120[1] || ((0x2401U >> (*apbStack_120[1] & 0x1f) & 1) == 0))) {
          apbStack_120[1] = apbStack_120[1] + 1;
        }
        for (; (*apbStack_120[1] == 0xd || (*apbStack_120[1] == 10));
            apbStack_120[1] = apbStack_120[1] + 1) {
        }
        this->iLineNumber = this->iLineNumber + 1;
        goto LAB_00610aac;
      }
    }
    iVar7 = (int)local_110;
    if (iVar7 == 0) {
      local_f8.iTexture = 0;
      lVar8 = 0x30;
      do {
        *(undefined8 *)((long)&local_110 + lVar8) = 0;
        *(undefined8 *)((long)&local_108 + lVar8) = 0;
        *(undefined8 *)((long)apbStack_120 + lVar8) = 0;
        *(undefined8 *)((long)apbStack_120 + lVar8 + 8) = 0;
        *(undefined8 *)((long)local_f8.avVertices + lVar8 + -0x10) = 0xffffffff00000000;
        *(undefined8 *)((long)local_f8.avVertices + lVar8 + -8) = 0;
        *(undefined8 *)((long)&local_f8.avVertices[0].pos.x + lVar8) = 0;
        *(undefined8 *)((long)&local_f8.avVertices[0].pos.z + lVar8) = 0;
        lVar8 = lVar8 + 0x40;
      } while (lVar8 != 0xf0);
      apbStack_120[0] = (byte *)0x610c06;
      std::vector<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>::
      emplace_back<Assimp::SMD::Face>(local_108,&local_f8);
      lVar8 = 0xc0;
      do {
        if (*(void **)((long)&local_108 + lVar8) != (void *)0x0) {
          apbStack_120[0] = (byte *)0x610c1a;
          operator_delete(*(void **)((long)&local_108 + lVar8));
        }
        lVar8 = lVar8 + -0x40;
      } while (lVar8 != 0);
      iVar7 = (int)local_110;
    }
    uVar4 = iVar7 + 1U;
    if (iVar7 + 1U == 3) {
      uVar4 = 0;
    }
    apbStack_120[0] = (byte *)0x610c5f;
    ParseVertex(this,(char *)apbStack_120[1],(char **)(apbStack_120 + 1),
                (Vertex *)
                ((long)(this->asTriangles).
                       super__Vector_base<Assimp::SMD::Face,_std::allocator<Assimp::SMD::Face>_>.
                       _M_impl.super__Vector_impl_data._M_finish + (ulong)uVar4 * 0x40 + -0xc0),true
               );
    local_110 = (ulong)uVar4;
  } while( true );
}

Assistant:

void SMDImporter::ParseVASection(const char* szCurrent, const char** szCurrentOut) {
    unsigned int iCurIndex = 0;
    for ( ;; ) {
        if (!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the "vertexanimation" section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        }

        // "time <n>\n"
        if (TokenMatch(szCurrent,"time",4)) {
            // NOTE: The doc says that time values COULD be negative ...
            // NOTE2: this is the shape key -> valve docs
            int iTime = 0;
            if(!ParseSignedInt(szCurrent,&szCurrent,iTime) || configFrameID != (unsigned int)iTime) {
                break;
            }
            SkipLine(szCurrent,&szCurrent);
        } else {
            if(0 == iCurIndex) {
                asTriangles.push_back(SMD::Face());
            }
            if (++iCurIndex == 3) {
                iCurIndex = 0;
            }
            ParseVertex(szCurrent,&szCurrent,asTriangles.back().avVertices[iCurIndex],true);
        }
    }

    if (iCurIndex != 2 && !asTriangles.empty()) {
        // we want to no degenerates, so throw this triangle away
        asTriangles.pop_back();
    }

    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    *szCurrentOut = szCurrent;
}